

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetAllocatedMessage
          (GeneratedMessageReflection *this,Message *message,Message *sub_message,
          FieldDescriptor *field)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Message *pMVar3;
  Message *sub_message_copy;
  FieldDescriptor *field_local;
  Message *sub_message_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  if (sub_message != (Message *)0x0) {
    iVar1 = (*(sub_message->super_MessageLite)._vptr_MessageLite[5])();
    iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[5])();
    if (CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) {
      iVar1 = (*(sub_message->super_MessageLite)._vptr_MessageLite[5])();
      if ((CONCAT44(extraout_var_01,iVar1) == 0) &&
         (iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[5])(),
         CONCAT44(extraout_var_02,iVar1) != 0)) {
        iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[5])();
        Arena::Own<google::protobuf::Message>((Arena *)CONCAT44(extraout_var_03,iVar1),sub_message);
        UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
        return;
      }
      pMVar3 = MutableMessage(this,message,field,(MessageFactory *)0x0);
      (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x11])(pMVar3,sub_message);
      return;
    }
  }
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void GeneratedMessageReflection::SetAllocatedMessage(
    Message* message,
    Message* sub_message,
    const FieldDescriptor* field) const {
  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != NULL &&
      sub_message->GetArena() != message->GetArena()) {
    if (sub_message->GetArena() == NULL && message->GetArena() != NULL) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArena()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}